

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::setTabOrder(QWidget *this,initializer_list<QWidget_*> widgets)

{
  QWidget *first;
  long lVar1;
  
  if (widgets._M_array != (iterator)0x0) {
    lVar1 = 0;
    first = (QWidget *)0x0;
    do {
      if (first != (QWidget *)0x0) {
        setTabOrder(first,*(QWidget **)(&this->super_QObject + lVar1));
      }
      first = *(QWidget **)(&this->super_QObject + lVar1);
      lVar1 = lVar1 + 8;
    } while ((long)widgets._M_array << 3 != lVar1);
  }
  return;
}

Assistant:

void QWidget::setTabOrder(std::initializer_list<QWidget *> widgets)
{
    QWidget *prev = nullptr;
    for (const auto &widget : widgets) {
        if (!prev) {
            prev = widget;
        } else {
            QWidget::setTabOrder(prev, widget);
            prev = widget;
        }
    }
}